

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O2

void __thiscall inject::no_component::~no_component(no_component *this)

{
  *(undefined ***)this = &PTR__no_component_0015fdd8;
  std::__cxx11::string::~string((string *)&this->_msg);
  std::__cxx11::string::~string((string *)&this->_name);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

virtual ~no_component() throw() { }